

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllRgbWidget.cpp
# Opt level: O3

void __thiscall AllRgbWidget::paintEvent(AllRgbWidget *this,QPaintEvent *param_1)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int extraout_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  QPainter p;
  QPainter aQStack_78 [8];
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  int iVar5;
  
  QPainter::QPainter(aQStack_78,(QPaintDevice *)&(this->super_PanAndZoomWidget).field_0x10);
  QPainter::save();
  PanAndZoomWidget::TransformPainter(&this->super_PanAndZoomWidget,aQStack_78);
  uVar3 = QImage::rect();
  iVar5 = (int)((ulong)uVar3 >> 0x20);
  iVar1 = QImage::rect();
  iVar2 = QImage::height();
  local_60 = (double)(((int)extraout_RDX - (int)uVar3) + 1);
  local_58 = (double)(((int)((ulong)extraout_RDX >> 0x20) - iVar5) + 1);
  local_70 = (double)-(((extraout_EDX - iVar1) - ((extraout_EDX - iVar1) + 1 >> 0x1f)) + 1 >> 1) +
             (double)(int)uVar3;
  local_68 = (double)-(iVar2 / 2) + (double)iVar5;
  uVar3 = QImage::rect();
  iVar1 = (int)((ulong)uVar3 >> 0x20);
  local_50 = (double)(int)uVar3;
  local_48 = (double)iVar1;
  local_40 = (double)(((int)extraout_RDX_00 - (int)uVar3) + 1);
  local_38 = (double)(((int)((ulong)extraout_RDX_00 >> 0x20) - iVar1) + 1);
  QPainter::drawImage(aQStack_78,&local_70,&this->allRgb_,&local_50,0);
  QPainter::restore();
  uVar3 = QImage::rect();
  iVar1 = (int)((ulong)uVar3 >> 0x20);
  uVar4 = QImage::rect();
  iVar2 = (int)((ulong)uVar4 >> 0x20);
  local_70 = (double)(int)uVar3;
  local_68 = (double)iVar1;
  local_60 = (double)(((int)extraout_RDX_01 - (int)uVar3) + 1);
  local_58 = (double)(((int)((ulong)extraout_RDX_01 >> 0x20) - iVar1) + 1);
  local_50 = (double)(int)uVar4;
  local_48 = (double)iVar2;
  local_40 = (double)(((int)extraout_RDX_02 - (int)uVar4) + 1);
  local_38 = (double)(((int)((ulong)extraout_RDX_02 >> 0x20) - iVar2) + 1);
  QPainter::drawImage(aQStack_78,&local_70,&this->targetThumbnail_,&local_50,0);
  QPainter::~QPainter(aQStack_78);
  return;
}

Assistant:

void AllRgbWidget::paintEvent(QPaintEvent* /*event*/)
{
    QPainter p(this);

    p.save();
    // centre the image around the origin
    TransformPainter(p);
    p.drawImage(QRectF(allRgb_.rect()).translated(allRgb_.rect().width() / -2, allRgb_.height() / -2), allRgb_, QRectF(allRgb_.rect()));
    p.restore();

    // draw thumbnail of target
    p.drawImage(targetThumbnail_.rect(), targetThumbnail_, targetThumbnail_.rect());
}